

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O3

int __thiscall
x86Argument::Decode(x86Argument *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize,bool x64,
                   bool useMmWord,bool skipSize)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  x86Reg xVar4;
  int iVar5;
  ulong uVar6;
  undefined1 *puVar7;
  CodeGenRegVmStateContext *pCVar8;
  uint *puVar9;
  char *pcVar10;
  int iVar11;
  ulong size;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  
  size = (ulong)bufSize;
  iVar11 = (int)buf;
  pcVar10 = buf;
  switch(this->type) {
  case argNumber:
    if (ctx->vsAsmStyle != true) {
      pCVar8 = (CodeGenRegVmStateContext *)(long)(this->field_1).num;
      if (pCVar8 == (CodeGenRegVmStateContext *)&ctx->callInstructionPos) {
        pcVar10 = "&ctx.callInstructionPos";
      }
      else if (pCVar8 == (CodeGenRegVmStateContext *)&ctx->dataStackTop) {
        pcVar10 = "&ctx.dataStackTop";
      }
      else if (pCVar8 == (CodeGenRegVmStateContext *)&ctx->callStackTop) {
        pcVar10 = "&ctx.callStackTop";
      }
      else if (pCVar8 == (CodeGenRegVmStateContext *)&ctx->regFileLastTop) {
        pcVar10 = "&ctx.regFileLastTop";
      }
      else if (pCVar8 == (CodeGenRegVmStateContext *)&ctx->regFileLastPtr) {
        pcVar10 = "&ctx.regFileLastPtr";
      }
      else if (pCVar8 == (CodeGenRegVmStateContext *)ctx->dataStackBase) {
        pcVar10 = "ctx.dataStackBase";
      }
      else {
        if (pCVar8 != (CodeGenRegVmStateContext *)ctx->ctx->exRegVmConstants) {
          if (pCVar8 == ctx) goto LAB_0025cb1a;
          pcVar10 = "%d";
          goto LAB_0025cb05;
        }
        pcVar10 = "ctx.exRegVmConstants";
      }
      goto LAB_0025ceaa;
    }
    pcVar10 = "";
    if (9 < (this->field_1).num) {
      pcVar10 = "h";
    }
    iVar5 = NULLC::SafeSprintf(buf,size,"%x%s",(ulong)(uint)(this->field_1).num,pcVar10);
    break;
  case argReg:
    puVar7 = (anonymous_namespace)::x86RegText;
    if (x64) {
      puVar7 = (anonymous_namespace)::x64RegText;
    }
    pcVar10 = *(char **)(puVar7 + (ulong)(this->field_1).reg * 8);
    goto LAB_0025cadb;
  case argXmmReg:
    pcVar10 = _ZN12_GLOBAL__N_113x86XmmRegTextE_rel +
              *(int *)(_ZN12_GLOBAL__N_113x86XmmRegTextE_rel + (ulong)(this->field_1).reg * 4);
LAB_0025cadb:
    strcpy(buf,pcVar10);
    sVar14 = strlen(buf);
    goto LAB_0025cebb;
  case argPtr:
    if (!skipSize) {
      puVar7 = (anonymous_namespace)::x86SizeText;
      if (useMmWord) {
        puVar7 = (anonymous_namespace)::x86XmmSizeText;
      }
      strcpy(buf,*(char **)(puVar7 + (ulong)(this->field_1).reg * 8));
      sVar14 = strlen(buf);
      pcVar10 = buf + sVar14;
      if (ctx->vsAsmStyle == true) {
        builtin_strncpy(buf + sVar14," ptr",4);
        pcVar10 = pcVar10 + 4;
      }
      *pcVar10 = ' ';
      pcVar10 = pcVar10 + 1;
    }
    pcVar10[0] = '[';
    pcVar10[1] = '\0';
    pcVar10 = pcVar10 + 1;
    if (ctx->vsAsmStyle == false) {
      if ((ulong)this->ptrIndex != 0) {
        puVar7 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar7 = (anonymous_namespace)::x64RegText;
        }
        strcpy(pcVar10,*(char **)(puVar7 + (ulong)this->ptrIndex * 8));
        sVar14 = strlen(pcVar10);
        pcVar10 = pcVar10 + sVar14;
      }
      if (1 < this->ptrMult) {
        iVar5 = NULLC::SafeSprintf(pcVar10,(ulong)((iVar11 - (int)pcVar10) + bufSize),"*%d");
        pcVar10 = pcVar10 + iVar5;
      }
    }
    uVar6 = (ulong)this->ptrBase;
    if (uVar6 != 0) {
      if (ctx->vsAsmStyle == true) {
        puVar7 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar7 = (anonymous_namespace)::x64RegText;
        }
        iVar5 = NULLC::SafeSprintf(pcVar10,(ulong)((iVar11 - (int)pcVar10) + bufSize),"%s",
                                   *(undefined8 *)(puVar7 + uVar6 * 8));
        pcVar10 = pcVar10 + iVar5;
      }
      else {
        puVar7 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar7 = (anonymous_namespace)::x64RegText;
        }
        if (this->ptrIndex == rNONE) {
          pcVar13 = "%s";
        }
        else {
          pcVar13 = " + %s";
        }
        iVar5 = NULLC::SafeSprintf(pcVar10,(ulong)((iVar11 - (int)pcVar10) + bufSize),pcVar13,
                                   *(undefined8 *)(puVar7 + uVar6 * 8));
        pcVar10 = pcVar10 + iVar5;
      }
    }
    if (ctx->vsAsmStyle == true) {
      xVar4 = this->ptrIndex;
      if (xVar4 != rNONE) {
        if (this->ptrBase != rNONE) {
          *pcVar10 = '+';
          pcVar10 = pcVar10 + 1;
          xVar4 = this->ptrIndex;
        }
        puVar7 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar7 = (anonymous_namespace)::x64RegText;
        }
        strcpy(pcVar10,*(char **)(puVar7 + (ulong)xVar4 * 8));
        sVar14 = strlen(pcVar10);
        pcVar10 = pcVar10 + sVar14;
      }
      if (1 < this->ptrMult) {
        iVar5 = NULLC::SafeSprintf(pcVar10,(ulong)((iVar11 - (int)pcVar10) + bufSize),"*%d");
        pcVar10 = pcVar10 + iVar5;
      }
    }
    iVar5 = (int)pcVar10;
    if (this->ptrBase == rNONE && this->ptrIndex == rNONE) {
      if (ctx->vsAsmStyle == true) {
        pcVar13 = "";
        if (9 < this->ptrNum) {
          pcVar13 = "h";
        }
        iVar5 = NULLC::SafeSprintf(pcVar10,(ulong)((iVar11 - iVar5) + bufSize),"%x%s",
                                   (ulong)(uint)this->ptrNum,pcVar13);
      }
      else {
        iVar2 = this->ptrNum;
        puVar9 = (uint *)(long)iVar2;
        if ((puVar9 < ctx->tempStackArrayBase) || (ctx->tempStackArrayEnd <= puVar9)) {
          if ((puVar9 < ctx->dataStackBase) || (ctx->dataStackEnd <= puVar9)) {
            puVar3 = ctx->ctx->exRegVmConstants;
            if ((puVar9 < puVar3) || (ctx->ctx->exRegVmConstantsEnd <= puVar9)) {
              if (puVar9 == &ctx->callInstructionPos) {
                sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                pcVar13 = "&ctx.callInstructionPos";
              }
              else if ((char **)puVar9 == &ctx->dataStackTop) {
                sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                pcVar13 = "&ctx.dataStackTop";
              }
              else if ((CodeGenRegVmCallStackEntry **)puVar9 == &ctx->callStackTop) {
                sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                pcVar13 = "&ctx.callStackTop";
              }
              else if ((RegVmRegister **)puVar9 == &ctx->regFileLastTop) {
                sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                pcVar13 = "&ctx.regFileLastTop";
              }
              else {
                if ((RegVmRegister **)puVar9 != &ctx->regFileLastPtr) {
                  if ((_func_void_CodeGenRegVmStateContext_ptr_uint **)puVar9 == &ctx->callWrap) {
                    sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                    pcVar13 = "&ctx.callWrap";
                  }
                  else if ((_func_void_CodeGenRegVmStateContext_ptr_uintptr_t_uint **)puVar9 ==
                           &ctx->checkedReturnWrap) {
                    sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                    pcVar13 = "&ctx.checkedReturnWrap";
                  }
                  else if ((_func_void_CodeGenRegVmStateContext_ptr_uint_uint **)puVar9 ==
                           &ctx->convertPtrWrap) {
                    sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                    pcVar13 = "&ctx.convertPtrWrap";
                  }
                  else if ((_func_void_CodeGenRegVmStateContext_ptr **)puVar9 ==
                           &ctx->errorOutOfBoundsWrap) {
                    sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                    pcVar13 = "&ctx.errorOutOfBoundsWrap";
                  }
                  else {
                    sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                    if ((_func_void_CodeGenRegVmStateContext_ptr **)puVar9 !=
                        &ctx->errorNoReturnWrap) {
                      pcVar13 = "%d";
                      goto LAB_0025cd51;
                    }
                    pcVar13 = "&ctx.errorNoReturnWrap";
                  }
                  iVar5 = NULLC::SafeSprintf(pcVar10,sVar12,pcVar13);
                  goto LAB_0025cd58;
                }
                sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
                pcVar13 = "&ctx.regFileLastPtr";
              }
              iVar5 = NULLC::SafeSprintf(pcVar10,sVar12,pcVar13);
              goto LAB_0025cd94;
            }
            sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
            uVar6 = (ulong)(uint)(iVar2 - (int)puVar3);
            pcVar13 = "constants+%u";
          }
          else {
            sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
            uVar6 = (ulong)(uint)(iVar2 - (int)ctx->dataStackBase);
            pcVar13 = "globals+%u";
          }
        }
        else {
          sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
          uVar6 = (ulong)(uint)(iVar2 - (int)ctx->tempStackArrayBase);
          pcVar13 = "temp+%u";
        }
        iVar5 = NULLC::SafeSprintf(pcVar10,sVar12,pcVar13,uVar6);
      }
LAB_0025cd94:
      pcVar10 = pcVar10 + iVar5;
    }
    else {
      uVar1 = this->ptrNum;
      if (uVar1 != 0) {
        sVar12 = (size_t)((iVar11 - iVar5) + bufSize);
        if (ctx->vsAsmStyle == true) {
          pcVar13 = "";
          if (9 < (int)uVar1) {
            pcVar13 = "h";
          }
          iVar5 = NULLC::SafeSprintf(pcVar10,sVar12,"+%x%s",(ulong)uVar1,pcVar13);
        }
        else {
          pcVar13 = "%+d";
LAB_0025cd51:
          iVar5 = NULLC::SafeSprintf(pcVar10,sVar12,pcVar13);
        }
LAB_0025cd58:
        pcVar10 = pcVar10 + iVar5;
      }
    }
    pcVar10[0] = ']';
    pcVar10[1] = '\0';
    pcVar10 = pcVar10 + 1;
    goto switchD_0025c91d_default;
  case argPtrLabel:
    iVar5 = NULLC::SafeSprintf(buf,size,"[\'0x%x\'+%d]",(ulong)(this->field_1).reg,
                               (ulong)(uint)this->ptrNum);
    break;
  case argLabel:
    pCVar8 = (CodeGenRegVmStateContext *)(ulong)(this->field_1).reg;
    pcVar10 = "\'0x%x\'";
LAB_0025cb05:
    iVar5 = NULLC::SafeSprintf(buf,size,pcVar10,pCVar8);
    break;
  case argImm64:
    pCVar8 = (CodeGenRegVmStateContext *)(this->field_1).imm64Arg;
    if (pCVar8 == ctx) {
LAB_0025cb1a:
      pcVar10 = "&ctx";
    }
    else if (pCVar8 == (CodeGenRegVmStateContext *)&ctx->tempStackArrayBase) {
      pcVar10 = "&ctx.tempStackArrayBase";
    }
    else {
      if (pCVar8 != (CodeGenRegVmStateContext *)ctx->tempStackArrayBase) {
        if (ctx->vsAsmStyle == true) {
          pcVar10 = "%llXh";
        }
        else {
          pcVar10 = "%lld";
        }
        iVar5 = NULLC::SafeSprintf(buf,size,pcVar10);
        break;
      }
      pcVar10 = "ctx.tempStackArrayBase";
    }
LAB_0025ceaa:
    iVar5 = NULLC::SafeSprintf(buf,size,pcVar10);
    break;
  default:
    goto switchD_0025c91d_default;
  }
  sVar14 = (size_t)iVar5;
LAB_0025cebb:
  pcVar10 = buf + sVar14;
switchD_0025c91d_default:
  if (pcVar10 < buf + size) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0xd2,
                  "int x86Argument::Decode(CodeGenRegVmStateContext &, char *, unsigned int, bool, bool, bool)"
                 );
  }
  return (int)pcVar10 - iVar11;
}

Assistant:

int x86Argument::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize, bool x64, bool useMmWord, bool skipSize)
{
	char *curr = buf;

	if(type == argNumber)
	{
		if(ctx.vsAsmStyle)
		{
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", num, num > 9 ? "h" : "");
		}
		else
		{
			if(uintptr_t(num) == uintptr_t(&ctx.callInstructionPos))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
			else if(uintptr_t(num) == uintptr_t(&ctx.dataStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.callStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastPtr))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
			else if(uintptr_t(num) == uintptr_t(ctx.dataStackBase))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.dataStackBase");
			else if(uintptr_t(num) == uintptr_t(ctx.ctx->exRegVmConstants))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.exRegVmConstants");
			else if(uintptr_t(num) == uintptr_t(&ctx))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", num);
		}
	}
	else if(type == argReg)
	{
		strcpy(curr, (x64 ? x64RegText : x86RegText)[reg]);
		curr += strlen(curr);
	}
	else if(type == argXmmReg)
	{
		strcpy(curr, x86XmmRegText[xmmArg]);
		curr += strlen(curr);
	}
	else if(type == argLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "'0x%x'", labelID);
	}
	else if(type == argPtrLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "['0x%x'+%d]", labelID, ptrNum);
	}
	else if(type == argPtr)
	{
		if(!skipSize)
		{
			strcpy(curr, (useMmWord ? x86XmmSizeText : x86SizeText)[ptrSize]);
			curr += strlen(curr);

			if(ctx.vsAsmStyle)
			{
				*curr++ = ' ';
				*curr++ = 'p';
				*curr++ = 't';
				*curr++ = 'r';
			}

			*curr++ = ' ';
		}

		*curr++ = '[';
		*curr = 0;

		if(!ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrBase != rNONE)
		{
			if(ctx.vsAsmStyle)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else if(ptrIndex != rNONE)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), " + %s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
		}

		if(ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				if(ptrBase != rNONE)
					*curr++ = '+';

				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrIndex == rNONE && ptrBase == rNONE && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.tempStackArrayBase) && uintptr_t(ptrNum) < uintptr_t(ctx.tempStackArrayEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "temp+%u", unsigned(ptrNum - uintptr_t(ctx.tempStackArrayBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.dataStackBase) && uintptr_t(ptrNum) < uintptr_t(ctx.dataStackEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "globals+%u", unsigned(ptrNum - uintptr_t(ctx.dataStackBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.ctx->exRegVmConstants) && uintptr_t(ptrNum) < uintptr_t(ctx.ctx->exRegVmConstantsEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "constants+%u", unsigned(ptrNum - uintptr_t(ctx.ctx->exRegVmConstants)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callInstructionPos))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.dataStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastPtr))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.checkedReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.checkedReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.convertPtrWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.convertPtrWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorOutOfBoundsWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorOutOfBoundsWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorNoReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorNoReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", ptrNum);
		else if(ptrNum != 0 && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "+%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrNum != 0)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%+d", ptrNum);

		*curr++ = ']';
		*curr = 0;
	}
	else if(type == argImm64)
	{
		if(imm64Arg == uintptr_t(&ctx))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
		else if(imm64Arg == uintptr_t(&ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.tempStackArrayBase");
		else if(imm64Arg == uintptr_t(ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.tempStackArrayBase");
		else if(ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%llXh", (unsigned long long)imm64Arg);
		else
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%lld", (long long)imm64Arg);
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}